

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::RgbaInputFile::RgbaInputFile
          (RgbaInputFile *this,IStream *is,string *layerName,int numThreads)

{
  RgbaChannels RVar1;
  void *pvVar2;
  undefined8 *in_RDI;
  RgbaChannels in_stack_00000034;
  RgbaChannels rgbaChannels;
  FromYca *in_stack_00000040;
  int in_stack_000001c4;
  IStream *in_stack_000001c8;
  InputFile *in_stack_000001d0;
  RgbaInputFile *this_00;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  string *in_stack_ffffffffffffffd8;
  
  *in_RDI = &PTR__RgbaInputFile_0040d280;
  pvVar2 = operator_new(0x10);
  InputFile::InputFile(in_stack_000001d0,in_stack_000001c8,in_stack_000001c4);
  in_RDI[1] = pvVar2;
  in_RDI[2] = 0;
  this_00 = (RgbaInputFile *)(in_RDI + 3);
  InputFile::header((InputFile *)in_RDI[1]);
  anon_unknown_1::prefixFromLayerName
            (in_stack_ffffffffffffffd8,
             (Header *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  RVar1 = channels(this_00);
  if ((RVar1 & WRITE_YC) != 0) {
    pvVar2 = operator_new(0x188);
    FromYca::FromYca(in_stack_00000040,_rgbaChannels,in_stack_00000034);
    in_RDI[2] = pvVar2;
  }
  return;
}

Assistant:

RgbaInputFile::RgbaInputFile (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream &is,
			      const string &layerName,
			      int numThreads)
:
    _inputFile (new InputFile (is, numThreads)),
    _fromYca (0),
    _channelNamePrefix (prefixFromLayerName (layerName, _inputFile->header()))
{
    RgbaChannels rgbaChannels = channels();

    if (rgbaChannels & (WRITE_Y | WRITE_C))
	_fromYca = new FromYca (*_inputFile, rgbaChannels);
}